

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void randomize(int *indices,int count)

{
  int iVar1;
  int iVar2;
  int temp;
  int iswap;
  int i;
  int count_local;
  int *indices_local;
  
  for (temp = count + -1; 0 < temp; temp = temp + -1) {
    iVar2 = rn2(temp + 1);
    if (iVar2 != temp) {
      iVar1 = indices[temp];
      indices[temp] = indices[iVar2];
      indices[iVar2] = iVar1;
    }
  }
  return;
}

Assistant:

static void randomize(int *indices, int count)
{
	int i, iswap, temp;

	for (i = count - 1; i > 0; i--) {
	    if ((iswap = rn2(i + 1)) == i) continue;
	    temp = indices[i];
	    indices[i] = indices[iswap];
	    indices[iswap] = temp;
	}
}